

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError AlsaStart(PaAlsaStream *stream,int priming)

{
  int iVar1;
  int iVar2;
  pthread_t pVar3;
  int in_ESI;
  long in_RDI;
  int __pa_unsure_error_id_4;
  int __pa_unsure_error_id_3;
  int __pa_unsure_error_id_2;
  int __pa_unsure_error_id_1;
  int __pa_unsure_error_id;
  PaError result;
  long in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  PaHostApiTypeId PVar4;
  PaAlsaStream *in_stack_ffffffffffffffc0;
  
  PVar4 = (PaHostApiTypeId)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  if (*(long *)(in_RDI + 0x340) != 0) {
    if (*(int *)(in_RDI + 0x224) == 0) {
      iVar1 = (*(code *)alsa_snd_pcm_prepare)(*(undefined8 *)(in_RDI + 0x340));
      if (iVar1 < 0) {
        pVar3 = pthread_self();
        iVar2 = pthread_equal(pVar3,paUnixMainThread);
        if (iVar2 != 0) {
          (*alsa_snd_strerror)(iVar1);
          PaUtil_SetLastHostErrorInfo(PVar4,in_stack_ffffffffffffffa8,(char *)0x11c78b);
        }
        PaUtil_DebugPrint(
                         "Expression \'alsa_snd_pcm_prepare( stream->playback.pcm )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2923\n"
                         );
        return -9999;
      }
    }
    else {
      if (in_ESI == 0) {
        iVar1 = (*(code *)alsa_snd_pcm_prepare)(*(undefined8 *)(in_RDI + 0x340));
        if (iVar1 < 0) {
          pVar3 = pthread_self();
          iVar2 = pthread_equal(pVar3,paUnixMainThread);
          if (iVar2 != 0) {
            (*alsa_snd_strerror)(iVar1);
            PaUtil_SetLastHostErrorInfo(PVar4,in_stack_ffffffffffffffa8,(char *)0x11c638);
          }
          PaUtil_DebugPrint(
                           "Expression \'alsa_snd_pcm_prepare( stream->playback.pcm )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2915\n"
                           );
          return -9999;
        }
        if (*(int *)(in_RDI + 800) != 0) {
          SilenceBuffer(in_stack_ffffffffffffffc0);
        }
      }
      if ((*(int *)(in_RDI + 800) != 0) &&
         (iVar1 = (*(code *)alsa_snd_pcm_start)(*(undefined8 *)(in_RDI + 0x340)), iVar1 < 0)) {
        pVar3 = pthread_self();
        iVar2 = pthread_equal(pVar3,paUnixMainThread);
        if (iVar2 != 0) {
          (*alsa_snd_strerror)(iVar1);
          PaUtil_SetLastHostErrorInfo(PVar4,in_stack_ffffffffffffffa8,(char *)0x11c6f4);
        }
        PaUtil_DebugPrint(
                         "Expression \'alsa_snd_pcm_start( stream->playback.pcm )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2920\n"
                         );
        return -9999;
      }
    }
  }
  if (*(long *)(in_RDI + 0x2c0) == 0) {
    return 0;
  }
  if (*(int *)(in_RDI + 0x228) == 0) {
    iVar1 = (*(code *)alsa_snd_pcm_prepare)(*(undefined8 *)(in_RDI + 0x2c0));
    if (iVar1 < 0) {
      pVar3 = pthread_self();
      iVar2 = pthread_equal(pVar3,paUnixMainThread);
      if (iVar2 != 0) {
        (*alsa_snd_strerror)(iVar1);
        PaUtil_SetLastHostErrorInfo(PVar4,in_stack_ffffffffffffffa8,(char *)0x11c844);
      }
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_pcm_prepare( stream->capture.pcm )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2927\n"
                       );
    }
    else {
      iVar1 = (*(code *)alsa_snd_pcm_start)(*(undefined8 *)(in_RDI + 0x2c0));
      if (-1 < iVar1) {
        return 0;
      }
      pVar3 = pthread_self();
      iVar2 = pthread_equal(pVar3,paUnixMainThread);
      if (iVar2 != 0) {
        PVar4 = iVar1 >> 0x1f;
        (*alsa_snd_strerror)(iVar1);
        PaUtil_SetLastHostErrorInfo(PVar4,in_stack_ffffffffffffffa8,(char *)0x11c8d4);
      }
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_pcm_start( stream->capture.pcm )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2929\n"
                       );
    }
    return -9999;
  }
  return 0;
}

Assistant:

static PaError AlsaStart( PaAlsaStream *stream, int priming )
{
    PaError result = paNoError;

    if( stream->playback.pcm )
    {
        if( stream->callbackMode )
        {
            if( !priming )
            {
                /* Buffer isn't primed, so prepare and silence */
                ENSURE_( alsa_snd_pcm_prepare( stream->playback.pcm ), paUnanticipatedHostError );
                if( stream->playback.canMmap )
                    SilenceBuffer( stream );
            }
            if( stream->playback.canMmap )
                ENSURE_( alsa_snd_pcm_start( stream->playback.pcm ), paUnanticipatedHostError );
        }
        else
            ENSURE_( alsa_snd_pcm_prepare( stream->playback.pcm ), paUnanticipatedHostError );
    }
    if( stream->capture.pcm && !stream->pcmsSynced )
    {
        ENSURE_( alsa_snd_pcm_prepare( stream->capture.pcm ), paUnanticipatedHostError );
        /* For a blocking stream we want to start capture as well, since nothing will happen otherwise */
        ENSURE_( alsa_snd_pcm_start( stream->capture.pcm ), paUnanticipatedHostError );
    }

end:
    return result;
error:
    goto end;
}